

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

char * square_apparent_look_in_preposition(chunk *c,loc_conflict grid)

{
  uint uVar1;
  square_conflict *psVar2;
  char *local_38;
  feature *local_30;
  feature *fp;
  wchar_t actual;
  chunk *c_local;
  loc_conflict grid_local;
  
  psVar2 = square(c,grid);
  uVar1 = (uint)psVar2->feat;
  if (f_info[(int)uVar1].mimic == (feature *)0x0) {
    local_30 = f_info + (int)uVar1;
  }
  else {
    local_30 = f_info[(int)uVar1].mimic;
  }
  if (local_30->look_in_preposition == (char *)0x0) {
    local_38 = "on ";
  }
  else {
    local_38 = local_30->look_in_preposition;
  }
  return local_38;
}

Assistant:

const char *square_apparent_look_in_preposition(struct chunk *c, struct loc grid) {
	int actual = square(c, grid)->feat;
	const struct feature *fp = f_info[actual].mimic ?
		f_info[actual].mimic : &f_info[actual];
	return (fp->look_in_preposition) ?  fp->look_in_preposition : "on ";
}